

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.h
# Opt level: O2

ssize_t __thiscall
kj::AsyncInputStream::read(AsyncInputStream *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> OStack_18;
  
  (*(code *)**(undefined8 **)CONCAT44(in_register_00000034,__fd))(&OStack_18);
  Promise<unsigned_long>::ignoreResult((Promise<unsigned_long> *)this);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&OStack_18);
  return (ssize_t)this;
}

Assistant:

Promise<void> read(ArrayPtr<byte> buffer) {
    return read(buffer, buffer.size()).ignoreResult();
  }